

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# w3interp.cpp
# Opt level: O0

void __thiscall w3Interp::Rotl_i64(w3Interp *this)

{
  uint64_t uVar1;
  uint64_t *puVar2;
  uint64_t a;
  uint64_t *r;
  uint32_t b;
  uint32_t n;
  w3Interp *this_local;
  
  uVar1 = w3Stack::pop_u64(&this->super_w3Stack);
  puVar2 = w3Stack::u64(&this->super_w3Stack);
  *puVar2 = *puVar2 << ((byte)uVar1 & 0x3f) | *puVar2 >> (0x40 - ((byte)uVar1 & 0x3f) & 0x3f);
  return;
}

Assistant:

INTERP (Rotl_i64)
{
    const uint32_t n = 64;
    const uint32_t b = (uint32_t)(pop_u64 () & (n - 1));
    uint64_t& r = u64 ();
    uint64_t a = r;
#if _MSC_VER > 1100 // TODO which version
    r = _rotl64 (a, (int)b);
#else
    r = (a << b) | (a >> (n - b));
#endif
}